

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::to_sampler_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t id)

{
  Variant *pVVar1;
  ulong uVar2;
  SPIRCombinedImageSampler *pSVar3;
  long lVar4;
  long *plVar5;
  size_type *psVar6;
  uint32_t id_00;
  string expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> array_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> image_expr;
  string local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar2 = (ulong)id;
  if ((uVar2 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr,
     pVVar1[uVar2].type == TypeCombinedImageSampler)) {
    pSVar3 = Variant::get<spirv_cross::SPIRCombinedImageSampler>(pVVar1 + uVar2);
  }
  else {
    pSVar3 = (SPIRCombinedImageSampler *)0x0;
  }
  if (pSVar3 != (SPIRCombinedImageSampler *)0x0) {
    id = (pSVar3->image).id;
  }
  CompilerGLSL::to_expression_abi_cxx11_(&local_b0,&this->super_CompilerGLSL,id,true);
  id_00 = 0;
  lVar4 = ::std::__cxx11::string::find((char)&local_b0,0x5b);
  if (pSVar3 != (SPIRCombinedImageSampler *)0x0) {
    id_00 = (pSVar3->sampler).id;
  }
  if (lVar4 == -1) {
    if (id_00 == 0) {
      ::std::operator+(__return_storage_ptr__,&local_b0,&this->sampler_name_suffix);
    }
    else {
      CompilerGLSL::to_expression_abi_cxx11_
                (__return_storage_ptr__,&this->super_CompilerGLSL,id_00,true);
    }
  }
  else {
    ::std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_b0);
    ::std::__cxx11::string::substr((ulong)local_90,(ulong)&local_b0);
    if (id_00 == 0) {
      ::std::operator+(&local_70,&local_50,&this->sampler_name_suffix);
      plVar5 = (long *)::std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90[0]);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar6) {
        lVar4 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
    }
    else {
      CompilerGLSL::to_expression_abi_cxx11_
                (__return_storage_ptr__,&this->super_CompilerGLSL,id_00,true);
    }
    if ((id_00 == 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2)) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_sampler_expression(uint32_t id)
{
	auto *combined = maybe_get<SPIRCombinedImageSampler>(id);
	auto expr = to_expression(combined ? combined->image : VariableID(id));
	auto index = expr.find_first_of('[');

	uint32_t samp_id = 0;
	if (combined)
		samp_id = combined->sampler;

	if (index == string::npos)
		return samp_id ? to_expression(samp_id) : expr + sampler_name_suffix;
	else
	{
		auto image_expr = expr.substr(0, index);
		auto array_expr = expr.substr(index);
		return samp_id ? to_expression(samp_id) : (image_expr + sampler_name_suffix + array_expr);
	}
}